

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::MultipleFieldsMapKeyComparator::IsMatchInternal
          (MultipleFieldsMapKeyComparator *this,Message *message1,Message *message2,int unpacked_any
          ,vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *parent_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *key_field_path,int path_index)

{
  FieldDescriptor *field;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Message *message1_00;
  Message *message2_00;
  Metadata MVar4;
  Metadata MVar5;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  value_type local_90;
  
  field = (key_field_path->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start[path_index];
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector(&current_parent_fields,parent_fields);
  if (((long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) + -1 == (long)path_index) {
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      bVar1 = CompareMapField(this->message_differencer_,message1,message2,unpacked_any,field,
                              &current_parent_fields);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(field);
      if (bVar1) {
        bVar1 = CompareRepeatedField
                          (this->message_differencer_,message1,message2,unpacked_any,field,
                           &current_parent_fields);
      }
      else {
        bVar1 = CompareFieldValueUsingParentFields
                          (this->message_differencer_,message1,message2,unpacked_any,field,-1,-1,
                           &current_parent_fields);
      }
    }
  }
  else {
    MVar4 = Message::GetMetadata(message1);
    MVar5 = Message::GetMetadata(message2);
    bVar2 = Reflection::HasField(MVar4.reflection,message1,field);
    bVar3 = Reflection::HasField(MVar5.reflection,message2,field);
    bVar1 = true;
    if (bVar2 || bVar3) {
      if (bVar2 == bVar3) {
        local_90.unknown_field_number = -1;
        local_90.unknown_field_type = TYPE_VARINT;
        local_90.index = -1;
        local_90.new_index = -1;
        local_90.map_entry1 = (Message *)0x0;
        local_90.map_entry2 = (Message *)0x0;
        local_90.unknown_field_set1 = (UnknownFieldSet *)0x0;
        local_90.unknown_field_set2 = (UnknownFieldSet *)0x0;
        local_90.unknown_field_index1 = -1;
        local_90.unknown_field_index2 = -1;
        local_90.forced_compare_no_presence_ = false;
        local_90.message1 = message1;
        local_90.message2 = message2;
        local_90.unpacked_any = unpacked_any;
        local_90.field = field;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(&current_parent_fields,&local_90);
        message1_00 = Reflection::GetMessage(MVar4.reflection,message1,field,(MessageFactory *)0x0);
        message2_00 = Reflection::GetMessage(MVar5.reflection,message2,field,(MessageFactory *)0x0);
        bVar1 = IsMatchInternal(this,message1_00,message2_00,0,&current_parent_fields,key_field_path
                                ,path_index + 1);
      }
      else {
        bVar1 = false;
      }
    }
  }
  std::
  _Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::~_Vector_base(&current_parent_fields.
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 );
  return bVar1;
}

Assistant:

bool IsMatchInternal(
      const Message& message1, const Message& message2, int unpacked_any,
      const std::vector<SpecificField>& parent_fields,
      const std::vector<const FieldDescriptor*>& key_field_path,
      int path_index) const {
    const FieldDescriptor* field = key_field_path[path_index];
    std::vector<SpecificField> current_parent_fields(parent_fields);
    if (path_index == static_cast<int64_t>(key_field_path.size() - 1)) {
      if (field->is_map()) {
        return message_differencer_->CompareMapField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else if (field->is_repeated()) {
        return message_differencer_->CompareRepeatedField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else {
        return message_differencer_->CompareFieldValueUsingParentFields(
            message1, message2, unpacked_any, field, -1, -1,
            &current_parent_fields);
      }
    } else {
      const Reflection* reflection1 = message1.GetReflection();
      const Reflection* reflection2 = message2.GetReflection();
      bool has_field1 = reflection1->HasField(message1, field);
      bool has_field2 = reflection2->HasField(message2, field);
      if (!has_field1 && !has_field2) {
        return true;
      }
      if (has_field1 != has_field2) {
        return false;
      }
      SpecificField specific_field;
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      current_parent_fields.push_back(specific_field);
      return IsMatchInternal(reflection1->GetMessage(message1, field),
                             reflection2->GetMessage(message2, field),
                             false /*key is never Any*/, current_parent_fields,
                             key_field_path, path_index + 1);
    }
  }